

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

id_type __thiscall Darts::Details::DawgBuilder::hash_node(DawgBuilder *this,id_type id)

{
  id_type iVar1;
  id_type hash_value;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0;
  while (id != 0) {
    lVar3 = (ulong)id * 0xc;
    iVar1 = DawgNode::unit((DawgNode *)((this->nodes_).buf_.array_ + lVar3));
    iVar1 = hash(*(int *)((this->nodes_).buf_.array_ + lVar3 + 8) << 0x18 ^ iVar1);
    uVar2 = uVar2 ^ iVar1;
    id = *(id_type *)((this->nodes_).buf_.array_ + lVar3 + 4);
  }
  return uVar2;
}

Assistant:

inline id_type DawgBuilder::hash_node(id_type id) const {
  id_type hash_value = 0;
  for ( ; id != 0; id = nodes_[id].sibling()) {
    id_type unit = nodes_[id].unit();
    uchar_type label = nodes_[id].label();
    hash_value ^= hash((label << 24) ^ unit);
  }
  return hash_value;
}